

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer
          (ConversionStream *this,iterator *Token,Uint32 *ShaderStorageBlockBinding)

{
  bool bVar1;
  bool bVar2;
  pointer pHVar3;
  Char *Message;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  char (*in_RCX) [97];
  allocator local_981;
  string local_980;
  allocator local_959;
  string local_958;
  HLSLTokenInfo local_938;
  const_iterator local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  allocator local_879;
  string local_878 [8];
  String NameRedefine;
  allocator local_849;
  string local_848;
  allocator local_821;
  string local_820;
  HLSLTokenInfo local_800;
  const_iterator local_7b0;
  _List_node_base *local_7a8;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  HLSLTokenInfo local_750;
  const_iterator local_700;
  _List_node_base *local_6f8;
  allocator local_6e9;
  string local_6e8;
  allocator local_6c1;
  string local_6c0;
  HLSLTokenInfo local_6a0;
  const_iterator local_650;
  _List_node_base *local_648;
  allocator local_639;
  string local_638;
  allocator local_611;
  string local_610;
  HLSLTokenInfo local_5f0;
  const_iterator local_5a0;
  String local_598;
  undefined1 local_578 [8];
  string err_9;
  undefined1 local_538 [8];
  string err_8;
  const_iterator local_508;
  iterator local_500;
  iterator CurrToken;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_4f0;
  iterator GlobalVarNameToken;
  allocator local_4d9;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  HLSLTokenInfo local_490;
  const_iterator local_440;
  String local_438;
  undefined1 local_418 [8];
  string err_7;
  undefined1 local_3d8 [8];
  string err_6;
  const_iterator local_3a8;
  iterator local_3a0;
  iterator ClosingAngleBracketTkn;
  undefined1 local_378 [8];
  string err_5;
  undefined1 local_338 [8];
  string err_4;
  String local_310;
  undefined1 local_2f0 [8];
  string err_3;
  undefined1 local_2b0 [8];
  string err_2;
  iterator local_288;
  iterator OpenBraceToken;
  undefined1 local_260 [8];
  string err_1;
  undefined1 local_220 [8];
  string err;
  string local_1f8 [32];
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [392];
  undefined1 local_40 [8];
  string msg;
  Uint32 *ShaderStorageBlockBinding_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = ShaderStorageBlockBinding;
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if ((pHVar3->Type != kw_StructuredBuffer) &&
     (pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
     pHVar3->Type != kw_RWStructuredBuffer)) {
    FormatString<char[26],char[97]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer"
               ,in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3d9);
    std::__cxx11::string::~string((string *)local_40);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar3->Type == kw_RWStructuredBuffer) {
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar4 = std::operator<<(local_1c8,"layout(binding=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)msg.field_2._8_8_);
    std::operator<<(poVar4,") buffer");
    std::__cxx11::stringstream::str();
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::operator=((string *)&pHVar3->Literal,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    *(int *)msg.field_2._8_8_ = *(int *)msg.field_2._8_8_ + 1;
    std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  else {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::operator=((string *)&pHVar3->Literal,"readonly buffer");
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[48]>
              ((string *)local_220,
               (char (*) [48])"Unexpected EOF after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_1.field_2 + 8),this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3e9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_220);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar1 = std::operator==(&pHVar3->Literal,"<");
  if (!bVar1) {
    FormatString<char[46]>
              ((string *)local_260,
               (char (*) [46])"\'<\' expected after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&OpenBraceToken,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&OpenBraceToken)
    ;
    std::__cxx11::string::~string((string *)&OpenBraceToken);
    std::__cxx11::string::~string((string *)local_260);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  std::__cxx11::string::operator=((string *)&pHVar3->Literal,"{");
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  pHVar3->Type = OpenBrace;
  local_288._M_node = Token->_M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err_2.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[21]>((string *)local_2b0,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_3.field_2 + 8),this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3f4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_3.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2b0);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar3->Type != Identifier) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar1 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar3);
    if (!bVar1) {
      FormatString<char[72]>
                ((string *)local_2f0,
                 (char (*) [72])
                 "Identifier or built-in type is expected in Structured Buffer definition");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_310,this,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessStructuredBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x3f5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2f0,(char (*) [2])0x46b1a3,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)local_2f0);
    }
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  err_4.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err_4.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[47]>
              ((string *)local_338,(char (*) [47])"Unexpected EOF in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_5.field_2 + 8),this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fa,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_5.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_5.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_338);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar1 = std::operator==(&pHVar3->Literal,">");
  if (!bVar1) {
    FormatString<char[35]>
              ((string *)local_378,(char (*) [35])"\'>\' expected after type definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&ClosingAngleBracketTkn,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &ClosingAngleBracketTkn);
    std::__cxx11::string::~string((string *)&ClosingAngleBracketTkn);
    std::__cxx11::string::~string((string *)local_378);
  }
  local_3a0._M_node = Token->_M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_3a8,&local_3a0);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (&this->m_Tokens,local_3a8);
  err_6.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err_6.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[21]>((string *)local_3d8,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_7.field_2 + 8),this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x401,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_7.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_7.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_3d8);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar3->Type != Identifier) {
    FormatString<char[52]>
              ((string *)local_418,
               (char (*) [52])"Identifier expected in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_438,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x402,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418
               ,(char (*) [2])0x46b1a3,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)local_418);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::operator=((string *)&pHVar3->Delimiter," ");
  }
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_440,&local_288);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,pcVar6,&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8," ",&local_4d9);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_490,Identifier,&local_4b0,&local_4d8,0xffffffffffffffff);
  GlobalVarNameToken =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       insert(&this->m_Tokens,local_440,&local_490);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_490);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  local_4f0._M_node = Token->_M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar1 = std::operator==(&pHVar3->Literal,":");
  if (bVar1) {
    while( true ) {
      CurrToken = std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,&CurrToken);
      bVar1 = false;
      if (bVar2) {
        pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        bVar1 = pHVar3->Type != Semicolon;
      }
      if (!bVar1) break;
      local_500._M_node = Token->_M_node;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_508,&local_500);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      erase(&this->m_Tokens,local_508);
    }
  }
  err_8.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err_8.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[21]>((string *)local_538,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&err_9.field_2 + 8),this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x421,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538
               ,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_9.field_2 + 8));
    std::__cxx11::string::~string((string *)(err_9.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_538);
  }
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar3->Type != Semicolon) {
    FormatString<char[13]>((string *)local_578,(char (*) [13])"\';\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_598,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x422,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578
               ,(char (*) [2])0x46b1a3,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)local_578);
  }
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_5a0,Token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_610,"[",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_638,"",&local_639);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_5f0,OpenSquareBracket,&local_610,&local_638,0xffffffffffffffff);
  local_648 = (_List_node_base *)
              std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::insert(&this->m_Tokens,local_5a0,&local_5f0);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_5f0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_650,Token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"]",&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"",&local_6e9);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_6a0,ClosingSquareBracket,&local_6c0,&local_6e8,0xffffffffffffffff);
  local_6f8 = (_List_node_base *)
              std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::insert(&this->m_Tokens,local_650,&local_6a0);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_6a0);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_700,Token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,";",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"",&local_799);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_750,Semicolon,&local_770,&local_798,0xffffffffffffffff);
  local_7a8 = (_List_node_base *)
              std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::insert(&this->m_Tokens,local_700,&local_750);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_750);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_7b0,Token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,"}",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_848,"",&local_849);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_800,ClosingBrace,&local_820,&local_848,0xffffffffffffffff);
  NameRedefine.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       insert(&this->m_Tokens,local_7b0,&local_800);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_800);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"#define ",&local_879);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_4f0);
  std::operator+(&local_8e0,&pHVar3->Literal,' ');
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_4f0);
  std::operator+(&local_8c0,&local_8e0,&pHVar3->Literal);
  std::operator+(&local_8a0,&local_8c0,"_data\r\n");
  std::__cxx11::string::operator+=(local_878,(string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_8e8,Token);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_958,pcVar6,&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_980,"\r\n",&local_981);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            (&local_938,TextBlock,&local_958,&local_980,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::insert
            (&this->m_Tokens,local_8e8,&local_938);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_938);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_4f0);
  std::__cxx11::string::append((char *)&pHVar3->Literal);
  std::__cxx11::string::~string(local_878);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer(TokenListType::iterator& Token, Uint32& ShaderStorageBlockBinding)
{
    // StructuredBuffer<DataType> g_Data;
    // ^
    VERIFY_EXPR(Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer);
    if (Token->Type == TokenType::kw_RWStructuredBuffer)
    {
        std::stringstream ss;
        ss << "layout(binding=" << ShaderStorageBlockBinding << ") buffer";
        Token->Literal = ss.str();
        ++ShaderStorageBlockBinding;
    }
    else
        Token->Literal = "readonly buffer";
    // buffer<DataType> g_Data;
    // ^

    ++Token;
    // buffer<DataType> g_Data;
    //       ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"StructuredBuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Literal == "<", "\'<\' expected after \"StructuredBuffer\" keyword");
    Token->Literal = "{";
    Token->Type    = TokenType::OpenBrace;
    // buffer{DataType> g_Data;
    //       ^
    auto OpenBraceToken = Token;

    ++Token;
    // buffer{DataType> g_Data;
    //        ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier || Token->IsBuiltInType(), "Identifier or built-in type is expected in Structured Buffer definition");

    ++Token;
    // buffer{DataType> g_Data;
    //                ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in Structured Buffer definition");
    VERIFY_PARSER_STATE(Token, Token->Literal == ">", "\'>\' expected after type definition");
    auto ClosingAngleBracketTkn = Token;
    ++Token;
    m_Tokens.erase(ClosingAngleBracketTkn);
    // buffer{DataType g_Data;
    //                 ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in Structured Buffer definition");
    if (Token->Delimiter.empty())
        Token->Delimiter = " ";

    m_Tokens.insert(OpenBraceToken, TokenInfo(TokenType::Identifier, Token->Literal.c_str(), " "));
    //          OpenBraceToken
    //              V
    // buffer g_Data{DataType g_Data;
    //                        ^
    auto GlobalVarNameToken = Token;

    ++Token;
    // buffer g_Data{DataType g_Data;
    //                              ^

    if (Token->Literal == ":")
    {
        // buffer g_Data{DataType g_Data : register(t0);
        //                               ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::Semicolon)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }

        // buffer g_Data{DataType g_Data ;
        //                               ^
    }
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Semicolon, "\';\' expected");

    m_Tokens.insert(Token, TokenInfo(TokenType::OpenSquareBracket, "["));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingSquareBracket, "]"));
    m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingBrace, "}"));
    // buffer g_Data{DataType g_Data[]};
    //                                 ^
    ++Token;
    String NameRedefine("#define ");
    NameRedefine += GlobalVarNameToken->Literal + ' ' + GlobalVarNameToken->Literal + "_data\r\n";
    m_Tokens.insert(Token, TokenInfo(TokenType::TextBlock, NameRedefine.c_str(), "\r\n"));
    GlobalVarNameToken->Literal.append("_data");
    // buffer g_Data{DataType g_Data_data[]};
    // #define g_Data g_Data_data
    //                           ^
}